

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubModel.cpp
# Opt level: O2

size_t __thiscall
iDynTree::SubModelDecomposition::getSubModelOfFrame
          (SubModelDecomposition *this,Model *model,FrameIndex *frame)

{
  ostream *poVar1;
  size_t sVar2;
  LinkIndex linkOfFrame;
  LinkIndex local_18;
  
  local_18 = Model::getFrameLink(model,*frame);
  if (local_18 == LINK_INVALID_INDEX) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "SubModelDecomposition error: requested frame index ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    poVar1 = std::operator<<(poVar1,"outside bounds ");
    std::endl<char,std::char_traits<char>>(poVar1);
    sVar2 = 0;
  }
  else {
    sVar2 = getSubModelOfLink(this,&local_18);
  }
  return sVar2;
}

Assistant:

size_t SubModelDecomposition::getSubModelOfFrame(const Model & model, const FrameIndex& frame) const
{
    size_t ret = 0;
    LinkIndex linkOfFrame = model.getFrameLink(frame);

    if( linkOfFrame != LINK_INVALID_INDEX )
    {
        ret = this->getSubModelOfLink(linkOfFrame);
    }
    else
    {
        std::cerr << "SubModelDecomposition error: requested frame index " << frame
                  << "outside bounds " << std::endl;
    }

    return ret;
}